

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O2

Flow * __thiscall
wasm::Precompute::precomputeExpression
          (Flow *__return_storage_ptr__,Precompute *this,Expression *curr,bool replaceExpression)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  PrecomputingExpressionRunner local_168;
  Flow local_c0;
  undefined1 auStack_78 [8];
  Flow flow;
  
  flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str
  ._M_str = (char *)0x0;
  flow.breakTo.super_IString.str._M_len = 0;
  auStack_78 = (undefined1  [8])0x0;
  flow.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  PrecomputingExpressionRunner::PrecomputingExpressionRunner
            (&local_168,
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
             ).
             super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
             .
             super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
             .currModule,&this->getValues,&this->heapValues,replaceExpression);
  ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit
            (&local_c0,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)&local_168,curr);
  Flow::operator=((Flow *)auStack_78,&local_c0);
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&local_c0);
  ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>::~ConstantExpressionRunner
            (&local_168.super_ConstantExpressionRunner<wasm::PrecomputingExpressionRunner>);
  if (replaceExpression && flow.breakTo.super_IString.str._M_len == 0) {
    bVar3 = canEmitConstantFor(this,(Literals *)auStack_78);
    uVar2 = NONCONSTANT_FLOW._8_8_;
    uVar1 = NONCONSTANT_FLOW._0_8_;
    if (!bVar3) {
      *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed
                        ._M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.
      id = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
      field_0.i64 = 0;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len = uVar1;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)uVar2;
      goto LAB_00b08560;
    }
  }
  Flow::Flow(__return_storage_ptr__,(Flow *)auStack_78);
LAB_00b08560:
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_78);
  return __return_storage_ptr__;
}

Assistant:

Flow precomputeExpression(Expression* curr, bool replaceExpression = true) {
    Flow flow;
    try {
      flow = PrecomputingExpressionRunner(
               getModule(), getValues, heapValues, replaceExpression)
               .visit(curr);
    } catch (NonconstantException&) {
      return Flow(NONCONSTANT_FLOW);
    }
    // If we are replacing the expression, then the resulting value must be of
    // a type we can emit a constant for.
    if (!flow.breaking() && replaceExpression &&
        !canEmitConstantFor(flow.values)) {
      return Flow(NONCONSTANT_FLOW);
    }
    return flow;
  }